

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

void __thiscall soul::StructuralParser::parseUsingDeclaration(StructuralParser *this)

{
  ModuleBase *pMVar1;
  Identifier usingName;
  Expression *pEVar2;
  PoolItem *pPVar3;
  Context context;
  Context local_58;
  pool_ref<soul::AST::UsingDeclaration> local_40;
  pool_ptr<soul::AST::Expression> local_38;
  
  local_58.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
  if (local_58.location.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_58.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_58.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_58.parentScope = this->currentScope;
  usingName = parseIdentifier(this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x259fb3);
  pEVar2 = parseType(this,usingDeclTarget);
  pMVar1 = (this->module).object;
  if (pMVar1 != (ModuleBase *)0x0) {
    pPVar3 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x40);
    local_38.object = pEVar2;
    AST::UsingDeclaration::UsingDeclaration
              ((UsingDeclaration *)&pPVar3->item,&local_58,usingName,&local_38);
    pPVar3->destructor =
         PoolAllocator::
         allocate<soul::AST::UsingDeclaration,_soul::AST::Context_&,_soul::Identifier_&,_soul::AST::Expression_&>
         ::anon_class_1_0_00000001::__invoke;
    local_40.object = (UsingDeclaration *)&pPVar3->item;
    std::
    vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>
    ::emplace_back<soul::pool_ref<soul::AST::UsingDeclaration>>
              ((vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>
                *)&pMVar1->usings,&local_40);
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_58.location.sourceCode.object);
    return;
  }
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseUsingDeclaration()
    {
        auto context = getContext();
        auto name = parseIdentifier();

        expect (Operator::assign);

        auto& type = parseType (ParseTypeContext::usingDeclTarget);
        module->usings.push_back (allocate<AST::UsingDeclaration> (context, name, type));

        expect (Operator::semicolon);
    }